

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O0

void __thiscall CommandLineOptions::CommandLineOptions(CommandLineOptions *this)

{
  uint uVar1;
  vector<bool,_std::allocator<bool>_> local_48;
  CommandLineOptions *local_10;
  CommandLineOptions *this_local;
  
  local_10 = this;
  std::__cxx11::string::string((string *)&this->comment);
  std::__cxx11::string::string((string *)&this->delimiter);
  std::__cxx11::string::string((string *)&this->fileInput);
  std::__cxx11::string::string((string *)&this->fileOutput);
  std::vector<bool,_std::allocator<bool>_>::vector(&this->filterColumns);
  DataFilters::DataFilters(&this->filterRows);
  SamplerOptions::SamplerOptions(&this->sampling);
  StatisticsTrackerOptions::StatisticsTrackerOptions(&this->statisticsOptions);
  this->blankEOF = false;
  std::__cxx11::string::operator=((string *)&this->comment,"");
  std::__cxx11::string::operator=((string *)&this->delimiter,"");
  std::__cxx11::string::operator=((string *)&this->fileInput,"");
  std::__cxx11::string::operator=((string *)&this->fileOutput,"");
  memset(&local_48,0,0x28);
  std::vector<bool,_std::allocator<bool>_>::vector(&local_48);
  std::vector<bool,_std::allocator<bool>_>::operator=(&this->filterColumns,&local_48);
  std::vector<bool,_std::allocator<bool>_>::~vector(&local_48);
  this->headerRow = 0;
  uVar1 = std::numeric_limits<int>::max();
  this->numLinesToKeep = uVar1;
  this->numLinesToReshape = 1;
  this->numLinesToSkip = 0;
  this->removeDuplicates = false;
  this->seed = 1;
  this->showCorrelation = false;
  this->showCovariance = false;
  this->showFilteredData = false;
  this->showHistogram = false;
  this->showLeastSquaresOffset = false;
  this->showLeastSquaresSlope = false;
  this->showStatistics = false;
  this->strictParsing = false;
  this->verboseLevel = '\0';
  return;
}

Assistant:

CommandLineOptions()
    {
        this->blankEOF = false;
        this->comment = "";
        this->delimiter = "";
        this->fileInput = "";
        this->fileOutput = "";
        this->filterColumns = std::vector<bool>();
        this->headerRow = 0;
        this->numLinesToKeep = std::numeric_limits<int>::max();
        this->numLinesToReshape = 1;
        this->numLinesToSkip = 0;
        this->removeDuplicates = false;
        this->seed = 1;
        this->showCorrelation = false;
        this->showCovariance = false;
        this->showFilteredData = false;
        this->showHistogram = false;
        this->showLeastSquaresOffset = false;
        this->showLeastSquaresSlope = false;
        this->showStatistics = false;
        this->strictParsing = false;
        this->verboseLevel = 0;
    }